

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

int mm_read_banner(FILE *f,MM_typecode *matcode)

{
  int iVar1;
  char *pcVar2;
  char **local_570;
  char *p;
  char storage_scheme [64];
  char data_type [64];
  char crd [64];
  char mtx [64];
  char banner [64];
  char line [1025];
  MM_typecode *matcode_local;
  FILE *f_local;
  
  builtin_strncpy(*matcode,"   G",4);
  pcVar2 = fgets(banner + 0x38,0x401,(FILE *)f);
  if (pcVar2 == (char *)0x0) {
    f_local._4_4_ = 0xc;
  }
  else {
    iVar1 = __isoc99_sscanf(banner + 0x38,"%s %s %s %s %s",mtx + 0x38,crd + 0x38,data_type + 0x38,
                            storage_scheme + 0x38,&p);
    if (iVar1 == 5) {
      for (local_570 = (char **)(crd + 0x38); *(char *)local_570 != '\0';
          local_570 = (char **)((long)local_570 + 1)) {
        iVar1 = tolower((int)*(char *)local_570);
        *(char *)local_570 = (char)iVar1;
      }
      for (local_570 = (char **)(data_type + 0x38); *(char *)local_570 != '\0';
          local_570 = (char **)((long)local_570 + 1)) {
        iVar1 = tolower((int)*(char *)local_570);
        *(char *)local_570 = (char)iVar1;
      }
      for (local_570 = (char **)(storage_scheme + 0x38); *(char *)local_570 != '\0';
          local_570 = (char **)((long)local_570 + 1)) {
        iVar1 = tolower((int)*(char *)local_570);
        *(char *)local_570 = (char)iVar1;
      }
      for (local_570 = &p; *(char *)local_570 != '\0'; local_570 = (char **)((long)local_570 + 1)) {
        iVar1 = tolower((int)*(char *)local_570);
        *(char *)local_570 = (char)iVar1;
      }
      iVar1 = strncmp(mtx + 0x38,"%%MatrixMarket",0xe);
      if (iVar1 == 0) {
        iVar1 = strcmp(crd + 0x38,"matrix");
        if (iVar1 == 0) {
          (*matcode)[0] = 'M';
          iVar1 = strcmp(data_type + 0x38,"coordinate");
          if (iVar1 == 0) {
            (*matcode)[1] = 'C';
          }
          else {
            iVar1 = strcmp(data_type + 0x38,"array");
            if (iVar1 != 0) {
              return 0xf;
            }
            (*matcode)[1] = 'A';
          }
          iVar1 = strcmp(storage_scheme + 0x38,"real");
          if (iVar1 == 0) {
            (*matcode)[2] = 'R';
          }
          else {
            iVar1 = strcmp(storage_scheme + 0x38,"complex");
            if (iVar1 == 0) {
              (*matcode)[2] = 'C';
            }
            else {
              iVar1 = strcmp(storage_scheme + 0x38,"pattern");
              if (iVar1 == 0) {
                (*matcode)[2] = 'P';
              }
              else {
                iVar1 = strcmp(storage_scheme + 0x38,"integer");
                if (iVar1 != 0) {
                  return 0xf;
                }
                (*matcode)[2] = 'I';
              }
            }
          }
          iVar1 = strcmp((char *)&p,"general");
          if (iVar1 == 0) {
            (*matcode)[3] = 'G';
          }
          else {
            iVar1 = strcmp((char *)&p,"symmetric");
            if (iVar1 == 0) {
              (*matcode)[3] = 'S';
            }
            else {
              iVar1 = strcmp((char *)&p,"hermitian");
              if (iVar1 == 0) {
                (*matcode)[3] = 'H';
              }
              else {
                iVar1 = strcmp((char *)&p,"skew-symmetric");
                if (iVar1 != 0) {
                  return 0xf;
                }
                (*matcode)[3] = 'K';
              }
            }
          }
          f_local._4_4_ = 0;
        }
        else {
          f_local._4_4_ = 0xf;
        }
      }
      else {
        f_local._4_4_ = 0xe;
      }
    }
    else {
      f_local._4_4_ = 0xc;
    }
  }
  return f_local._4_4_;
}

Assistant:

int mm_read_banner(FILE *f, MM_typecode *matcode) {
    char line[MM_MAX_LINE_LENGTH];
    char banner[MM_MAX_TOKEN_LENGTH];
    char mtx[MM_MAX_TOKEN_LENGTH];
    char crd[MM_MAX_TOKEN_LENGTH];
    char data_type[MM_MAX_TOKEN_LENGTH];
    char storage_scheme[MM_MAX_TOKEN_LENGTH];
    char *p;


    mm_clear_typecode(matcode);

    if (fgets(line, MM_MAX_LINE_LENGTH, f) == NULL)
        return MM_PREMATURE_EOF;

    if (sscanf(line, "%s %s %s %s %s", banner, mtx, crd, data_type,
               storage_scheme) != 5)
        return MM_PREMATURE_EOF;

    for (p = mtx; *p != '\0'; *p = tolower(*p), p++);  /* convert to lower case */
    for (p = crd; *p != '\0'; *p = tolower(*p), p++);
    for (p = data_type; *p != '\0'; *p = tolower(*p), p++);
    for (p = storage_scheme; *p != '\0'; *p = tolower(*p), p++);

    /* check for banner */
    if (strncmp(banner, MatrixMarketBanner, strlen(MatrixMarketBanner)) != 0)
        return MM_NO_HEADER;

    /* first field should be "mtx" */
    if (strcmp(mtx, MM_MTX_STR) != 0)
        return MM_UNSUPPORTED_TYPE;
    mm_set_matrix(matcode);


    /* second field describes whether this is a sparse matrix (in coordinate
            storgae) or a dense array */


    if (strcmp(crd, MM_SPARSE_STR) == 0)
        mm_set_sparse(matcode);
    else if (strcmp(crd, MM_DENSE_STR) == 0)
        mm_set_dense(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    /* third field */

    if (strcmp(data_type, MM_REAL_STR) == 0)
        mm_set_real(matcode);
    else if (strcmp(data_type, MM_COMPLEX_STR) == 0)
        mm_set_complex(matcode);
    else if (strcmp(data_type, MM_PATTERN_STR) == 0)
        mm_set_pattern(matcode);
    else if (strcmp(data_type, MM_INT_STR) == 0)
        mm_set_integer(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    /* fourth field */

    if (strcmp(storage_scheme, MM_GENERAL_STR) == 0)
        mm_set_general(matcode);
    else if (strcmp(storage_scheme, MM_SYMM_STR) == 0)
        mm_set_symmetric(matcode);
    else if (strcmp(storage_scheme, MM_HERM_STR) == 0)
        mm_set_hermitian(matcode);
    else if (strcmp(storage_scheme, MM_SKEW_STR) == 0)
        mm_set_skew(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    return 0;
}